

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O0

wchar_t object_value_base(object *obj)

{
  _Bool _Var1;
  object *obj_local;
  
  _Var1 = object_flavor_is_aware(obj);
  if (_Var1) {
    obj_local._4_4_ = obj->kind->cost;
  }
  else {
    switch(obj->tval) {
    case '\x14':
    case '\x15':
      obj_local._4_4_ = L'-';
      break;
    case '\x16':
      obj_local._4_4_ = L'F';
      break;
    case '\x17':
      obj_local._4_4_ = L'2';
      break;
    case '\x18':
      obj_local._4_4_ = L'Z';
      break;
    case '\x19':
    case '\x1a':
      obj_local._4_4_ = L'\x14';
      break;
    default:
      obj_local._4_4_ = L'\0';
      break;
    case '\x1c':
    case '\x1d':
      obj_local._4_4_ = L'\x05';
    }
  }
  return obj_local._4_4_;
}

Assistant:

static int object_value_base(const struct object *obj)
{
	/* Use template cost for aware objects */
	if (object_flavor_is_aware(obj))
		return obj->kind->cost;

	/* Analyze the type */
	switch (obj->tval)
	{
		case TV_FOOD:
		case TV_MUSHROOM:
			return 5;
		case TV_POTION:
		case TV_SCROLL:
			return 20;
		case TV_RING:
		case TV_AMULET:
			return 45;
		case TV_WAND:
			return 50;
		case TV_STAFF:
			return 70;
		case TV_ROD:
			return 90;
	}

	return 0;
}